

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::GLSLangUtils::GLSLtoSPIRV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          GLSLtoSPIRVAttribs *Attribs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SpirvVersion SVar2;
  EShLanguage s;
  spv_target_env TargetEnv;
  char (*in_RCX) [61];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  EProfile shProfile;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  string Preamble;
  int Lengths [1];
  char *ShaderStrings [1];
  IncluderImpl Includer;
  TShader Shader;
  
  if ((Attribs->ShaderSource == (char *)0x0) || (Attribs->SourceCodeLen < 1)) {
    FormatString<char[26],char[61]>
              ((string *)&Shader,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attribs.ShaderSource != nullptr && Attribs.SourceCodeLen > 0",in_RCX)
    ;
    DebugAssertionFailed
              ((Char *)Shader._vptr_TShader,"GLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1f9);
    if (Shader._vptr_TShader != (_func_int **)&Shader.stage) {
      operator_delete(Shader._vptr_TShader,Shader._16_8_ + 1);
    }
  }
  s = anon_unknown_3::ShaderTypeToShLanguage(Attribs->ShaderType);
  glslang::TShader::TShader(&Shader,s);
  shProfile = ENoProfile;
  anon_unknown_3::SetupWithSpirvVersion(&Shader,&shProfile,s,Attribs->Version,EShSourceGlsl);
  SVar2 = Attribs->Version;
  ShaderStrings[0] = Attribs->ShaderSource;
  Lengths[0] = Attribs->SourceCodeLen;
  glslang::TShader::setStringsWithLengths(&Shader,ShaderStrings,Lengths,1);
  paVar1 = &Preamble.field_2;
  Preamble._M_string_length = 0;
  Preamble.field_2._M_local_buf[0] = '\0';
  Preamble._M_dataplus._M_p = (pointer)paVar1;
  if (Attribs->UseRowMajorMatrices == true) {
    std::__cxx11::string::append((char *)&Preamble);
  }
  std::__cxx11::string::append((char *)&Preamble);
  if (((Attribs->Macros).Elements != (ShaderMacro *)0x0) && ((Attribs->Macros).Count != 0)) {
    AppendShaderMacros(&Preamble,&Attribs->Macros);
  }
  Shader.preamble = Preamble._M_dataplus._M_p;
  Includer.m_pInputStreamFactory = Attribs->pShaderSourceStreamFactory;
  Includer.super_Includer._vptr_Includer = (_func_int **)&PTR_includeSystem_00af5900;
  Includer.m_IncludeRes._M_h._M_buckets = &Includer.m_IncludeRes._M_h._M_single_bucket;
  Includer.m_IncludeRes._M_h._M_bucket_count = 1;
  Includer.m_IncludeRes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Includer.m_IncludeRes._M_h._M_element_count = 0;
  Includer.m_IncludeRes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Includer.m_IncludeRes._M_h._M_rehash_policy._M_next_resize = 0;
  Includer.m_IncludeRes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Includer.m_DataBlobs._M_h._M_buckets = &Includer.m_DataBlobs._M_h._M_single_bucket;
  Includer.m_DataBlobs._M_h._M_bucket_count = 1;
  Includer.m_DataBlobs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Includer.m_DataBlobs._M_h._M_element_count = 0;
  Includer.m_DataBlobs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Includer.m_DataBlobs._M_h._M_rehash_policy._M_next_resize = 0;
  Includer.m_DataBlobs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  anon_unknown_3::CompileShaderInternal
            (&local_1c8,&Shader,(uint)((SVar2 & ~Vk110) != GL) << 4 | EShMsgSpvRules,
             &Includer.super_Includer,Attribs->ShaderSource,(long)Attribs->SourceCodeLen,
             Attribs->AssignBindings,shProfile,Attribs->ppCompilerOutput);
  if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    TargetEnv = anon_unknown_3::SpirvVersionToSpvTargetEnv(Attribs->Version);
    OptimizeSPIRV(&local_1a0,&local_1c8,TargetEnv,SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    if (local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      LogError<false,char[27]>
                (false,"GLSLtoSPIRV",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
                 ,0x220,(char (*) [27])"Failed to optimize SPIR-V.");
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start =
           local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a0.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start =
           local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    }
    if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  Includer.super_Includer._vptr_Includer = (_func_int **)&PTR_includeSystem_00af5900;
  std::
  _Hashtable<glslang::TShader::Includer::IncludeResult_*,_std::pair<glslang::TShader::Includer::IncludeResult_*const,_Diligent::RefCntAutoPtr<Diligent::IDataBlob>_>,_std::allocator<std::pair<glslang::TShader::Includer::IncludeResult_*const,_Diligent::RefCntAutoPtr<Diligent::IDataBlob>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TShader::Includer::IncludeResult_*>,_std::hash<glslang::TShader::Includer::IncludeResult_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&Includer.m_DataBlobs._M_h);
  std::
  _Hashtable<std::unique_ptr<glslang::TShader::Includer::IncludeResult,_std::default_delete<glslang::TShader::Includer::IncludeResult>_>,_std::unique_ptr<glslang::TShader::Includer::IncludeResult,_std::default_delete<glslang::TShader::Includer::IncludeResult>_>,_std::allocator<std::unique_ptr<glslang::TShader::Includer::IncludeResult,_std::default_delete<glslang::TShader::Includer::IncludeResult>_>_>,_std::__detail::_Identity,_std::equal_to<std::unique_ptr<glslang::TShader::Includer::IncludeResult,_std::default_delete<glslang::TShader::Includer::IncludeResult>_>_>,_std::hash<std::unique_ptr<glslang::TShader::Includer::IncludeResult,_std::default_delete<glslang::TShader::Includer::IncludeResult>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&Includer.m_IncludeRes._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)Preamble._M_dataplus._M_p != paVar1) {
    operator_delete(Preamble._M_dataplus._M_p,
                    CONCAT71(Preamble.field_2._M_allocated_capacity._1_7_,
                             Preamble.field_2._M_local_buf[0]) + 1);
  }
  glslang::TShader::~TShader(&Shader);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> GLSLtoSPIRV(const GLSLtoSPIRVAttribs& Attribs)
{
    VERIFY_EXPR(Attribs.ShaderSource != nullptr && Attribs.SourceCodeLen > 0);

    const EShLanguage  ShLang = ShaderTypeToShLanguage(Attribs.ShaderType);
    ::glslang::TShader Shader(ShLang);
    ::EProfile         shProfile = EProfile::ENoProfile;

    SetupWithSpirvVersion(Shader, shProfile, ShLang, Attribs.Version, ::glslang::EShSourceGlsl);

    EShMessages messages = EShMsgSpvRules;
    static_assert(static_cast<int>(SpirvVersion::Count) == 6, "Did you add a new member to SpirvVersion? You may need to handle it here.");
    if (Attribs.Version != SpirvVersion::GL && Attribs.Version != SpirvVersion::GLES)
        messages = static_cast<EShMessages>(messages | EShMsgVulkanRules);

    const char* ShaderStrings[] = {Attribs.ShaderSource};
    int         Lengths[]       = {Attribs.SourceCodeLen};
    Shader.setStringsWithLengths(ShaderStrings, Lengths, 1);

    std::string Preamble;
    if (Attribs.UseRowMajorMatrices)
        Preamble += "layout(row_major) uniform;\n\n";
    Preamble.append("#define GLSLANG\n\n");
    if (Attribs.Macros)
        AppendShaderMacros(Preamble, Attribs.Macros);
    Shader.setPreamble(Preamble.c_str());

    IncluderImpl Includer{Attribs.pShaderSourceStreamFactory};

    auto SPIRV = CompileShaderInternal(Shader, messages, &Includer, Attribs.ShaderSource, Attribs.SourceCodeLen, Attribs.AssignBindings, shProfile, Attribs.ppCompilerOutput);
    if (SPIRV.empty())
        return SPIRV;

#ifdef USE_SPIRV_TOOLS
    auto OptimizedSPIRV = OptimizeSPIRV(SPIRV, SpirvVersionToSpvTargetEnv(Attribs.Version), SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    if (!OptimizedSPIRV.empty())
    {
        return OptimizedSPIRV;
    }
    else
    {
        LOG_ERROR("Failed to optimize SPIR-V.");
    }
#endif
    return SPIRV;
}